

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_connection.cpp
# Opt level: O3

int __thiscall cpp_db::sqlite_connection::open(sqlite_connection *this,char *__file,int __oflag,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  sqlite3 *psVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RAX;
  runtime_error *this_01;
  sqlite_exception *this_02;
  sqlite3 *__tmp;
  sqlite3 *dbptr;
  sqlite3 *local_40 [2];
  sqlite3 local_30 [16];
  
  iVar2 = (*(this->super_connection_interface)._vptr_connection_interface[4])(this,__file,___oflag);
  if ((char)iVar2 != '\0') {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Database already open","");
    std::runtime_error::runtime_error(this_01,(string *)local_40);
    *(undefined ***)this_01 = &PTR__runtime_error_00197840;
    __cxa_throw(this_01,&db_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_40[0] = (element_type *)0x0;
  iVar2 = sqlite3_open_v2(*(undefined8 *)__file,local_40,6,0);
  psVar1 = local_40[0];
  if (iVar2 == 0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00197ad0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)psVar1;
    (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr = psVar1;
    this_00 = (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      p_Var3 = extraout_RAX;
    }
    return (int)p_Var3;
  }
  this_02 = (sqlite_exception *)__cxa_allocate_exception(0x18);
  sqlite_exception::sqlite_exception(this_02,iVar2,local_40[0]);
  __cxa_throw(this_02,&sqlite_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sqlite_connection::open(const std::string &database, const authentication &, const key_value_pair &)
{
    if (is_open())
        throw db_exception("Database already open");

    sqlite3 *dbptr(nullptr);
    if (int error_code = sqlite3_open_v2(database.c_str(), &dbptr, SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, nullptr))
        throw sqlite_exception(error_code, dbptr);
    db.reset(dbptr, [](sqlite3 *db)
    {
        if (int error_code = sqlite3_close(db))
            throw sqlite_exception(error_code, db);
    }
    );
}